

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::previous_sibling(xml_node *this,char_t *name_)

{
  bool bVar1;
  long *in_RDI;
  xml_node_struct *i;
  xml_node_struct *p;
  xml_node local_8;
  
  if (*in_RDI == 0) {
    xml_node(&local_8);
  }
  else {
    for (p = *(xml_node_struct **)(*in_RDI + 0x28); p->next_sibling != (xml_node_struct *)0x0;
        p = p->prev_sibling_c) {
      if ((p->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal((char_t *)p,(char_t *)in_RDI), bVar1)) {
        xml_node(&local_8,p);
        return (xml_node)local_8._root;
      }
    }
    xml_node(&local_8);
  }
  return (xml_node)local_8._root;
}

Assistant:

PUGI__FN xml_node xml_node::previous_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->prev_sibling_c; i->next_sibling; i = i->prev_sibling_c)
			if (i->name && impl::strequal(name_, i->name)) return xml_node(i);

		return xml_node();
	}